

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int vdbeSorterCompareText
              (SortSubtask *pTask,int *pbKey2Cached,void *pKey1,int nKey1,void *pKey2,int nKey2)

{
  uint local_84;
  int local_64;
  uint local_60;
  int res;
  int n2;
  int n1;
  u8 *v2;
  u8 *v1;
  u8 *p2;
  u8 *p1;
  void *pvStack_30;
  int nKey2_local;
  void *pKey2_local;
  void *pvStack_20;
  int nKey1_local;
  void *pKey1_local;
  int *pbKey2Cached_local;
  SortSubtask *pTask_local;
  
  v2 = (u8 *)((long)pKey1 + (ulong)*pKey1);
  _n2 = (void *)((long)pKey2 + (ulong)*pKey2);
  v1 = (u8 *)pKey2;
  p2 = (u8 *)pKey1;
  p1._4_4_ = nKey2;
  pvStack_30 = pKey2;
  pKey2_local._4_4_ = nKey1;
  pvStack_20 = pKey1;
  pKey1_local = pbKey2Cached;
  pbKey2Cached_local = (int *)pTask;
  if (*(byte *)((long)pKey1 + 1) < 0x80) {
    res = (int)*(byte *)((long)pKey1 + 1);
  }
  else {
    sqlite3GetVarint32((uchar *)((long)pKey1 + 1),(u32 *)&res);
  }
  if (v1[1] < 0x80) {
    local_60 = (uint)v1[1];
  }
  else {
    sqlite3GetVarint32(v1 + 1,&local_60);
  }
  if (res < (int)local_60) {
    local_84 = res;
  }
  else {
    local_84 = local_60;
  }
  local_64 = memcmp(v2,_n2,(long)((int)(local_84 - 0xd) / 2));
  if (local_64 == 0) {
    local_64 = res - local_60;
  }
  if (local_64 == 0) {
    if (1 < *(ushort *)(*(long *)(*(long *)(pbKey2Cached_local + 4) + 0x28) + 6)) {
      local_64 = vdbeSorterCompareTail
                           ((SortSubtask *)pbKey2Cached_local,(int *)pKey1_local,pvStack_20,
                            pKey2_local._4_4_,pvStack_30,p1._4_4_);
    }
  }
  else if (**(char **)(*(long *)(*(long *)(pbKey2Cached_local + 4) + 0x28) + 0x18) != '\0') {
    local_64 = -local_64;
  }
  return local_64;
}

Assistant:

static int vdbeSorterCompareText(
  SortSubtask *pTask,             /* Subtask context (for pKeyInfo) */
  int *pbKey2Cached,              /* True if pTask->pUnpacked is pKey2 */
  const void *pKey1, int nKey1,   /* Left side of comparison */
  const void *pKey2, int nKey2    /* Right side of comparison */
){
  const u8 * const p1 = (const u8 * const)pKey1;
  const u8 * const p2 = (const u8 * const)pKey2;
  const u8 * const v1 = &p1[ p1[0] ];   /* Pointer to value 1 */
  const u8 * const v2 = &p2[ p2[0] ];   /* Pointer to value 2 */

  int n1;
  int n2;
  int res;

  getVarint32(&p1[1], n1);
  getVarint32(&p2[1], n2);
  res = memcmp(v1, v2, (MIN(n1, n2) - 13)/2);
  if( res==0 ){
    res = n1 - n2;
  }

  if( res==0 ){
    if( pTask->pSorter->pKeyInfo->nField>1 ){
      res = vdbeSorterCompareTail(
          pTask, pbKey2Cached, pKey1, nKey1, pKey2, nKey2
      );
    }
  }else{
    if( pTask->pSorter->pKeyInfo->aSortOrder[0] ){
      res = res * -1;
    }
  }

  return res;
}